

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0> *
__thiscall
cpptrace::detail::libdwarf::die_object::get_string_attribute_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *__return_storage_ptr__,die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  int iVar1;
  char *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string str;
  undefined1 local_90 [8];
  raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0,_0>
  strwrapper;
  char **local_58;
  char *local_50;
  char *raw_str;
  undefined1 local_40 [8];
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:147:51),_0,_0,_0>
  attwrapper;
  Dwarf_Attribute_s *local_28;
  Dwarf_Attribute attr;
  die_object *pdStack_18;
  Dwarf_Half attr_num_local;
  die_object *this_local;
  
  attwrapper._8_8_ = &local_28;
  attr._6_2_ = attr_num;
  pdStack_18 = this;
  this_local = (die_object *)__return_storage_ptr__;
  iVar1 = wrap<Dwarf_Die_s_*,_unsigned_short,_Dwarf_Attribute_s_**,_Dwarf_Error_s_**,_Dwarf_Die_s_*const_&,_unsigned_short_&,_Dwarf_Attribute_s_**,_0>
                    (this,dwarf_attr,&this->die,(unsigned_short *)((long)&attr + 6),
                     (Dwarf_Attribute_s ***)&attwrapper.deleter);
  if (iVar1 == 0) {
    raii_wrap<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:147:51),_0,_0>
              (local_40,local_28);
    local_58 = &local_50;
    iVar1 = wrap<Dwarf_Attribute_s_*,_char_**,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_char_**,_0>
                      (this,dwarf_formstring,&local_28,&local_58);
    source_location::source_location
              ((source_location *)&strwrapper.deleter.holds_value,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0x95);
    location._8_8_ = in_stack_ffffffffffffff10;
    location.file = in_stack_ffffffffffffff08;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x24cba8,
                      "optional<std::string> cpptrace::detail::libdwarf::die_object::get_string_attribute(Dwarf_Half) const"
                      ,(char *)strwrapper.deleter._8_8_,location);
    str.field_2._8_8_ = this;
    raii_wrap<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0>
              ((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0,_0>
                *)local_90,local_50,(anon_class_8_1_8991fb9c_for_uvalue)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,local_50,&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:150:54),_0,_0,_0>
    ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0,_0>
                     *)local_90);
    raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:147:51),_0,_0,_0>
    ::~raii_wrapper((raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:147:51),_0,_0,_0>
                     *)local_40);
  }
  else {
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
    optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> get_string_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            if(wrap(dwarf_attr, die, attr_num, &attr) == DW_DLV_OK) {
                auto attwrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
                char* raw_str;
                VERIFY(wrap(dwarf_formstring, attr, &raw_str) == DW_DLV_OK);
                auto strwrapper = raii_wrap(raw_str, [this] (char* str) { dwarf_dealloc(dbg, str, DW_DLA_STRING); });
                std::string str = raw_str;
                return str;
            } else {
                return nullopt;
            }
        }